

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_packet_requirev
              (LIBSSH2_SFTP *sftp,int num_valid_responses,uchar *valid_responses,uint32_t request_id
              ,uchar **data,size_t *data_len,size_t required_size)

{
  long lVar1;
  int iVar2;
  time_t tVar3;
  long left;
  int rc;
  int i;
  size_t *data_len_local;
  uchar **data_local;
  uint32_t request_id_local;
  uchar *valid_responses_local;
  int num_valid_responses_local;
  LIBSSH2_SFTP *sftp_local;
  
  if (((data == (uchar **)0x0) || (data_len == (size_t *)0x0)) || (required_size == 0)) {
    sftp_local._4_4_ = -0x27;
  }
  else {
    if (sftp->requirev_start == 0) {
      tVar3 = time((time_t *)0x0);
      sftp->requirev_start = tVar3;
    }
    do {
      do {
        if (sftp->channel->session->socket_state != 0) {
          sftp->requirev_start = 0;
          return -0xd;
        }
        for (left._4_4_ = 0; left._4_4_ < num_valid_responses; left._4_4_ = left._4_4_ + 1) {
          iVar2 = sftp_packet_ask(sftp,valid_responses[left._4_4_],request_id,data,data_len);
          if (iVar2 == 0) {
            sftp->requirev_start = 0;
            if (*data_len < required_size) {
              return -0x26;
            }
            return 0;
          }
        }
        sftp_local._4_4_ = sftp_packet_read(sftp);
        if ((sftp_local._4_4_ < 0) && (sftp_local._4_4_ != -0x25)) {
          sftp->requirev_start = 0;
          return sftp_local._4_4_;
        }
      } while (0 < sftp_local._4_4_);
      lVar1 = sftp->channel->session->packet_read_timeout;
      tVar3 = time((time_t *)0x0);
      if (lVar1 - (tVar3 - sftp->requirev_start) < 1) {
        sftp->requirev_start = 0;
        return -9;
      }
    } while (sftp_local._4_4_ != -0x25);
  }
  return sftp_local._4_4_;
}

Assistant:

static int
sftp_packet_requirev(LIBSSH2_SFTP *sftp, int num_valid_responses,
                     const unsigned char *valid_responses,
                     uint32_t request_id, unsigned char **data,
                     size_t *data_len, size_t required_size)
{
    int i;
    int rc;

    if(!data || !data_len || required_size == 0) {
        return LIBSSH2_ERROR_BAD_USE;
    }

    /* If no timeout is active, start a new one */
    if(sftp->requirev_start == 0)
        sftp->requirev_start = time(NULL);

    while(sftp->channel->session->socket_state == LIBSSH2_SOCKET_CONNECTED) {
        for(i = 0; i < num_valid_responses; i++) {
            if(sftp_packet_ask(sftp, valid_responses[i], request_id,
                               data, data_len) == 0) {
                /*
                 * Set to zero before all returns to say
                 * the timeout is not active
                 */
                sftp->requirev_start = 0;

                if(*data_len < required_size) {
                    return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                }

                return LIBSSH2_ERROR_NONE;
            }
        }

        rc = sftp_packet_read(sftp);
        if((rc < 0) && (rc != LIBSSH2_ERROR_EAGAIN)) {
            sftp->requirev_start = 0;
            return rc;
        }
        else if(rc <= 0) {
            /* prevent busy-looping */
            long left =
                sftp->channel->session->packet_read_timeout -
                (long)(time(NULL) - sftp->requirev_start);

            if(left <= 0) {
                sftp->requirev_start = 0;
                return LIBSSH2_ERROR_TIMEOUT;
            }
            else if(rc == LIBSSH2_ERROR_EAGAIN) {
                return rc;
            }
        }
    }

    sftp->requirev_start = 0;

    /* Only reached if the socket died */
    return LIBSSH2_ERROR_SOCKET_DISCONNECT;
}